

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O2

void test_skiplist_query_exist_populated_several(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  int local_8c;
  ion_byte_t value [10];
  char find_value [10];
  ion_byte_t test_value [10];
  ion_skiplist_t skiplist;
  
  initialize_skiplist_std_conditions(&skiplist);
  for (local_8c = 0; local_8c < 100; local_8c = local_8c + 1) {
    sprintf((char *)test_value,"Find %d");
    iVar2 = sl_insert(&skiplist,&local_8c,test_value);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar2.error == '\0'),0x326,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_001029f7;
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(((ulong)iVar2 & 0xffffffff00000000) == 0x100000000),0x327,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') goto LAB_001029f7;
  }
  local_8c = 0;
  while( true ) {
    if (99 < local_8c) {
      sl_destroy(&skiplist);
      return;
    }
    sprintf(find_value,"Find %d");
    iVar2 = sl_get(&skiplist,&local_8c,value);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar2.error == '\0'),0x336,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') break;
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(((ulong)iVar2 & 0xffffffff00000000) == 0x100000000),0x337,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') break;
    pVar1 = planck_unit_assert_str_are_equal
                      (tc,(char *)value,find_value,0x338,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                      );
    if (pVar1 == '\0') break;
    local_8c = local_8c + 1;
  }
LAB_001029f7:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_query_exist_populated_several(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t test_value[10];

	int i;

	for (i = 0; i < 100; i++) {
		sprintf((char *) test_value, "Find %d", i);

		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &i, test_value);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	char		find_value[10];
	ion_byte_t	value[10];

	for (i = 0; i < 100; i++) {
		sprintf(find_value, "Find %d", i);

		ion_status_t status = sl_get(&skiplist, (ion_key_t) &i, value);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
		PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, find_value);
	}

	sl_destroy(&skiplist);
}